

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSpecificationElement.cpp
# Opt level: O3

int __thiscall DIS::RecordSpecificationElement::getMarshalledSize(RecordSpecificationElement *this)

{
  return 0xf;
}

Assistant:

int RecordSpecificationElement::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _recordID
   marshalSize = marshalSize + 4;  // _recordSetSerialNumber
   marshalSize = marshalSize + 2;  // _recordLength
   marshalSize = marshalSize + 2;  // _recordCount
   marshalSize = marshalSize + 2;  // _recordValues
   marshalSize = marshalSize + 1;  // _pad4
    return marshalSize;
}